

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

bool __thiscall
cmCTestVC::RunUpdateCommand
          (cmCTestVC *this,char **cmd,OutputParser *out,OutputParser *err,Encoding encoding)

{
  bool bVar1;
  ostream *poVar2;
  string local_58;
  Encoding local_34;
  OutputParser *pOStack_30;
  Encoding encoding_local;
  OutputParser *err_local;
  OutputParser *out_local;
  char **cmd_local;
  cmCTestVC *this_local;
  
  local_34 = encoding;
  pOStack_30 = err;
  err_local = out;
  out_local = (OutputParser *)cmd;
  cmd_local = (char **)this;
  ComputeCommandLine_abi_cxx11_(&local_58,(cmCTestVC *)cmd,(char **)out);
  std::__cxx11::string::operator=((string *)&this->UpdateCommandLine,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = cmCTest::GetShowOnly(this->CTest);
  if (bVar1) {
    poVar2 = std::operator<<(this->Log,(string *)&this->UpdateCommandLine);
    std::operator<<(poVar2,"\n");
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = RunChild(this,(char **)out_local,err_local,pOStack_30,(char *)0x0,local_34);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestVC::RunUpdateCommand(char const* const* cmd, OutputParser* out,
                                 OutputParser* err, Encoding encoding)
{
  // Report the command line.
  this->UpdateCommandLine = this->ComputeCommandLine(cmd);
  if (this->CTest->GetShowOnly()) {
    this->Log << this->UpdateCommandLine << "\n";
    return true;
  }

  // Run the command.
  return this->RunChild(cmd, out, err, CM_NULLPTR, encoding);
}